

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  _PDCLIB_seed = _PDCLIB_seed * 0x41c64e6d + 0x3039;
  uVar1 = (uint)(_PDCLIB_seed >> 0x10);
  uVar2 = uVar1 + 0x7fff;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1;
  }
  iVar3 = uVar1 - (uVar2 & 0xffff8000);
  if (0x7ffe < iVar3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/rand.c, line %d - %s\n"
           ,0x1a,"( rnd1 = rand() ) < RAND_MAX");
  }
  _PDCLIB_seed = _PDCLIB_seed * 0x41c64e6d + 0x3039;
  uVar1 = (uint)(_PDCLIB_seed >> 0x10);
  uVar2 = uVar1 + 0x7fff;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1;
  }
  iVar4 = uVar1 - (uVar2 & 0xffff8000);
  if (0x7ffe < iVar4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/rand.c, line %d - %s\n"
           ,0x1b,"( rnd2 = rand() ) < RAND_MAX");
  }
  srand(1);
  _PDCLIB_seed = _PDCLIB_seed * 0x41c64e6d + 0x3039;
  uVar1 = (uint)(_PDCLIB_seed >> 0x10);
  uVar2 = uVar1 + 0x7fff;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1;
  }
  if (uVar1 - (uVar2 & 0xffff8000) != iVar3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/rand.c, line %d - %s\n"
           ,0x1d,"rand() == rnd1");
  }
  _PDCLIB_seed = _PDCLIB_seed * 0x41c64e6d + 0x3039;
  uVar1 = (uint)(_PDCLIB_seed >> 0x10);
  uVar2 = uVar1 + 0x7fff;
  if (-1 < (int)uVar1) {
    uVar2 = uVar1;
  }
  if (uVar1 - (uVar2 & 0xffff8000) != iVar4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/rand.c, line %d - %s\n"
           ,0x1e,"rand() == rnd2");
  }
  return TEST_RESULTS;
}

Assistant:

int rand( void )
{
    _PDCLIB_seed = _PDCLIB_seed * 1103515245 + 12345;
    return ( int )( _PDCLIB_seed / 65536 ) % 32768;
}